

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void __thiscall
QList<BezierEase::SingleCubicBezier>::QList
          (QList<BezierEase::SingleCubicBezier> *this,qsizetype size)

{
  QArrayDataPointer<BezierEase::SingleCubicBezier>::QArrayDataPointer(&this->d,size,0,KeepSize);
  if (size != 0) {
    QArrayDataPointer<BezierEase::SingleCubicBezier>::appendInitialize(&this->d,size);
  }
  return;
}

Assistant:

explicit QList(qsizetype size)
        : d(size)
    {
        if (size)
            d->appendInitialize(size);
    }